

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_showref.cpp
# Opt level: O2

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::BindShowQuery(Binder *this,ShowRef *ref)

{
  idx_t iVar1;
  bool bVar2;
  Binder *this_00;
  type node;
  Allocator *allocator;
  pointer pCVar3;
  type op;
  reference __lhs;
  TableCatalogEntry *table;
  ColumnDefinition *pCVar4;
  string *__rhs;
  reference other;
  pointer pLVar5;
  long in_RDX;
  long lVar6;
  ulong column_index;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  templated_unique_single_t collection;
  allocator_type local_2c9;
  Binder *local_2c8;
  BaseTableColumnInfo result;
  value_type type;
  vector<duckdb::LogicalType,_true> return_types;
  Value local_278;
  shared_ptr<duckdb::Binder,_true> child_binder;
  DataChunk output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  return_names;
  BoundStatement plan;
  LogicalType local_198;
  LogicalType local_180;
  LogicalType local_168;
  ColumnDataAppendState append_state;
  LogicalType local_f0;
  undefined1 local_d8 [40];
  string local_b0 [32];
  string local_90;
  string local_70;
  string local_50;
  
  local_2c8 = (Binder *)ref;
  CreateBinder((Binder *)&child_binder,(ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p
               ,(optional_ptr<duckdb::Binder,_true>)ref,REGULAR_BINDER);
  this_00 = shared_ptr<duckdb::Binder,_true>::operator->(&child_binder);
  node = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
                   ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                    (in_RDX + 0x88));
  Bind(&plan,this_00,node);
  ::std::__cxx11::string::string((string *)&append_state,"column_name",(allocator *)&output);
  ::std::__cxx11::string::string
            ((string *)&append_state.current_chunk_state.handles._M_h._M_rehash_policy,"column_type"
             ,(allocator *)&local_278);
  ::std::__cxx11::string::string
            ((string *)&append_state.vector_data,"null",(allocator *)&return_types);
  ::std::__cxx11::string::string((string *)&local_f0,"key",(allocator *)&type);
  ::std::__cxx11::string::string((string *)(local_d8 + 8),"default",(allocator *)&result);
  ::std::__cxx11::string::string(local_b0,"extra",(allocator *)&collection);
  __l._M_len = 6;
  __l._M_array = (iterator)&append_state;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&return_names,__l,&local_2c9);
  lVar6 = 0xa0;
  do {
    ::std::__cxx11::string::~string
              ((string *)((long)&append_state.current_chunk_state.handles._M_h._M_buckets + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  LogicalType::LogicalType((LogicalType *)&append_state,VARCHAR);
  LogicalType::LogicalType
            ((LogicalType *)&append_state.current_chunk_state.handles._M_h._M_element_count,VARCHAR)
  ;
  LogicalType::LogicalType
            ((LogicalType *)&append_state.current_chunk_state.handles._M_h._M_single_bucket,VARCHAR)
  ;
  LogicalType::LogicalType
            ((LogicalType *)
             &append_state.vector_data.
              super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
              .
              super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
              ._M_impl.super__Vector_impl_data._M_finish,VARCHAR);
  LogicalType::LogicalType(&local_f0,VARCHAR);
  LogicalType::LogicalType((LogicalType *)local_d8,VARCHAR);
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&append_state;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             __l_00,(allocator_type *)&output);
  lVar6 = 0x78;
  do {
    LogicalType::~LogicalType
              ((LogicalType *)
               ((long)&append_state.current_chunk_state.handles._M_h._M_buckets + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  DataChunk::DataChunk(&output);
  allocator = Allocator::Get((ClientContext *)(((string *)&local_2c8->context)->_M_dataplus)._M_p);
  DataChunk::Initialize(&output,allocator,&return_types,0x800);
  make_uniq<duckdb::ColumnDataCollection,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&>
            ((duckdb *)&collection,
             (ClientContext *)(((string *)&local_2c8->context)->_M_dataplus)._M_p,&return_types);
  append_state.current_chunk_state.handles._M_h._M_buckets =
       &append_state.current_chunk_state.handles._M_h._M_single_bucket;
  append_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
  append_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  append_state.current_chunk_state.handles._M_h._M_element_count = 0;
  append_state.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  append_state.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  append_state.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  append_state.current_chunk_state.properties = INVALID;
  append_state.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  append_state.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  append_state.vector_data.
  super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  super__Vector_base<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator->(&collection);
  ColumnDataCollection::InitializeAppend(pCVar3,&append_state);
  for (column_index = 0;
      column_index <
      (ulong)(((long)plan.types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)plan.types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x18);
      column_index = column_index + 1) {
    op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*(&plan.plan);
    result = FindBaseTableColumn(op,column_index);
    iVar1 = output.count;
    __lhs = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::get<true>(&plan.names,column_index);
    if (result.table.ptr == (TableCatalogEntry *)0x0) {
      other = vector<duckdb::LogicalType,_true>::get<true>(&plan.types,column_index);
      LogicalType::LogicalType(&type,other);
      ::std::__cxx11::string::string((string *)&local_70,(string *)__lhs);
      Value::Value(&local_278,&local_70);
      DataChunk::SetValue(&output,0,iVar1,&local_278);
      Value::~Value(&local_278);
      ::std::__cxx11::string::~string((string *)&local_70);
      LogicalType::ToString_abi_cxx11_(&local_90,&type);
      Value::Value(&local_278,&local_90);
      DataChunk::SetValue(&output,1,iVar1,&local_278);
      Value::~Value(&local_278);
      ::std::__cxx11::string::~string((string *)&local_90);
      Value::Value(&local_278,"YES");
      DataChunk::SetValue(&output,2,iVar1,&local_278);
      Value::~Value(&local_278);
      LogicalType::LogicalType(&local_168,SQLNULL);
      Value::Value(&local_278,&local_168);
      DataChunk::SetValue(&output,3,iVar1,&local_278);
      Value::~Value(&local_278);
      LogicalType::~LogicalType(&local_168);
      LogicalType::LogicalType(&local_180,SQLNULL);
      Value::Value(&local_278,&local_180);
      DataChunk::SetValue(&output,4,iVar1,&local_278);
      Value::~Value(&local_278);
      LogicalType::~LogicalType(&local_180);
      LogicalType::LogicalType(&local_198,SQLNULL);
      Value::Value(&local_278,&local_198);
      DataChunk::SetValue(&output,5,iVar1,&local_278);
      Value::~Value(&local_278);
      LogicalType::~LogicalType(&local_198);
      LogicalType::~LogicalType(&type);
    }
    else {
      table = optional_ptr<duckdb::TableCatalogEntry,_true>::operator*(&result.table);
      pCVar4 = optional_ptr<const_duckdb::ColumnDefinition,_true>::operator*(&result.column);
      PragmaTableInfo::GetColumnInfo(table,pCVar4,&output,iVar1);
      pCVar4 = optional_ptr<const_duckdb::ColumnDefinition,_true>::operator->(&result.column);
      __rhs = ColumnDefinition::Name_abi_cxx11_(pCVar4);
      bVar2 = ::std::operator!=(__lhs,__rhs);
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
        Value::Value(&local_278,&local_50);
        DataChunk::SetValue(&output,0,iVar1,&local_278);
        Value::~Value(&local_278);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
    }
    output.count = output.count + 1;
    if (output.count == 0x800) {
      pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
               ::operator->(&collection);
      ColumnDataCollection::Append(pCVar3,&append_state,&output);
      DataChunk::Reset(&output);
    }
  }
  pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator->(&collection);
  ColumnDataCollection::Append(pCVar3,&append_state,&output);
  local_278.type_._0_8_ = GenerateTableIndex(local_2c8);
  make_uniq<duckdb::LogicalColumnDataGet,unsigned_long,duckdb::vector<duckdb::LogicalType,true>&,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>
            ((duckdb *)&type,(unsigned_long *)&local_278,&return_types,&collection);
  pLVar5 = unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
           ::operator->((unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
                         *)&type);
  iVar1 = pLVar5->table_index;
  ::std::__cxx11::string::string((string *)&local_278,"__show_select",(allocator *)&result);
  BindContext::AddGenericBinding
            (&local_2c8->bind_context,iVar1,(string *)&local_278,&return_names,&return_types);
  ::std::__cxx11::string::~string((string *)&local_278);
  make_uniq<duckdb::BoundTableFunction,duckdb::unique_ptr<duckdb::LogicalColumnDataGet,std::default_delete<duckdb::LogicalColumnDataGet>,true>>
            ((duckdb *)&local_278,
             (unique_ptr<duckdb::LogicalColumnDataGet,_std::default_delete<duckdb::LogicalColumnDataGet>,_true>
              *)&type);
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_278.type_._0_8_;
  if (type._0_8_ != 0) {
    (**(code **)(*(long *)type._0_8_ + 8))();
  }
  ColumnDataAppendState::~ColumnDataAppendState(&append_state);
  ::std::
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
  ~unique_ptr(&collection.
               super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
             );
  DataChunk::~DataChunk(&output);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&return_names);
  BoundStatement::~BoundStatement(&plan);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::BindShowQuery(ShowRef &ref) {
	// bind the child plan of the DESCRIBE statement
	auto child_binder = Binder::CreateBinder(context, this);
	auto plan = child_binder->Bind(*ref.query);

	// construct a column data collection with the result
	vector<string> return_names = {"column_name", "column_type", "null", "key", "default", "extra"};
	vector<LogicalType> return_types = {LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR,
	                                    LogicalType::VARCHAR, LogicalType::VARCHAR, LogicalType::VARCHAR};
	DataChunk output;
	output.Initialize(Allocator::Get(context), return_types);

	auto collection = make_uniq<ColumnDataCollection>(context, return_types);
	ColumnDataAppendState append_state;
	collection->InitializeAppend(append_state);
	for (idx_t column_idx = 0; column_idx < plan.types.size(); column_idx++) {
		// check if we can trace the column to a base table so that we can figure out constraint information
		auto result = FindBaseTableColumn(*plan.plan, column_idx);
		idx_t row_index = output.size();
		auto &alias = plan.names[column_idx];
		if (result.table) {
			// we can! emit the information from the base table directly
			PragmaTableInfo::GetColumnInfo(*result.table, *result.column, output, row_index);
			// Override the base column name with the alias if one is specified.
			if (alias != result.column->Name()) {
				output.SetValue(0, row_index, Value(alias));
			}
		} else {
			// we cannot - read the type/name from the plan instead
			auto type = plan.types[column_idx];

			// "name", TypeId::VARCHAR
			output.SetValue(0, row_index, Value(alias));
			// "type", TypeId::VARCHAR
			output.SetValue(1, row_index, Value(type.ToString()));
			// "null", TypeId::VARCHAR
			output.SetValue(2, row_index, Value("YES"));
			// "pk", TypeId::BOOL
			output.SetValue(3, row_index, Value());
			// "dflt_value", TypeId::VARCHAR
			output.SetValue(4, row_index, Value());
			// "extra", TypeId::VARCHAR
			output.SetValue(5, row_index, Value());
		}

		output.SetCardinality(output.size() + 1);
		if (output.size() == STANDARD_VECTOR_SIZE) {
			collection->Append(append_state, output);
			output.Reset();
		}
	}
	collection->Append(append_state, output);

	auto show = make_uniq<LogicalColumnDataGet>(GenerateTableIndex(), return_types, std::move(collection));
	bind_context.AddGenericBinding(show->table_index, "__show_select", return_names, return_types);
	return make_uniq<BoundTableFunction>(std::move(show));
}